

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

void __thiscall
wasm::Fuzzer::run(Fuzzer *this,uint64_t seed,uint64_t *latticeElementSeed,string *funcName)

{
  pointer this_00;
  ostream *poVar1;
  result_type rVar2;
  Function *func;
  undefined8 uVar3;
  ulong uVar4;
  Name NVar5;
  anon_class_16_2_f436c85a visitor;
  undefined1 local_1180 [8];
  RandEngine getRand;
  TranslateToFuzzReader reader;
  Module testModule;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> bytes;
  
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &this->verbose;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *)local_1180,seed);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running with seed ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_50,0x1000,
             (allocator_type *)&reader.nesting);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_50); uVar4 = uVar4 + 8) {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_1180);
    *(result_type *)((long)local_50 + uVar4) = rVar2;
  }
  Module::Module((Module *)&reader.nesting);
  this_00 = bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
  uVar3 = 0;
  TranslateToFuzzReader::TranslateToFuzzReader
            ((TranslateToFuzzReader *)&getRand._M_p,(Module *)&reader.nesting,
             (vector<char,_std::allocator<char>_> *)local_50,false);
  TranslateToFuzzReader::build((TranslateToFuzzReader *)&getRand._M_p);
  if (*this_00 == '\x01') {
    std::operator<<((ostream *)&std::cout,"Generated test module: \n");
    std::operator<<((ostream *)&std::cout,(Module *)&reader.nesting);
    std::operator<<((ostream *)&std::cout,"\n");
  }
  visitor.this._1_7_ = (undefined7)((ulong)uVar3 >> 8);
  visitor.this._0_1_ = funcName == (string *)0x0 || latticeElementSeed == (uint64_t *)0x0;
  if (visitor.this._0_1_) {
    visitor.getRand = (RandEngine *)this_00;
    ModuleUtils::
    iterDefinedFunctions<wasm::Fuzzer::run(unsigned_long,unsigned_long*,std::__cxx11::string*)::_lambda(wasm::Function*)_1_>
              ((ModuleUtils *)&reader.nesting,(Module *)local_1180,visitor);
  }
  else {
    IString::IString((IString *)&testModule.tagsMap._M_h._M_single_bucket,funcName);
    NVar5.super_IString.str._M_str = (char *)testModule.tagsMap._M_h._M_single_bucket;
    NVar5.super_IString.str._M_len = (size_t)&reader.nesting;
    func = (Function *)wasm::Module::getFunction(NVar5);
    runOnFunction((Fuzzer *)this_00,func,*latticeElementSeed);
  }
  TranslateToFuzzReader::~TranslateToFuzzReader((TranslateToFuzzReader *)&getRand._M_p);
  Module::~Module((Module *)&reader.nesting);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_50);
  return;
}

Assistant:

void run(uint64_t seed,
           uint64_t* latticeElementSeed = nullptr,
           std::string* funcName = nullptr) {
    RandEngine getRand(seed);
    std::cout << "Running with seed " << seed << "\n";

    // 4kb of random bytes should be enough for anyone!
    std::vector<char> bytes(4096);
    for (size_t i = 0; i < bytes.size(); i += sizeof(uint64_t)) {
      *(uint64_t*)(bytes.data() + i) = getRand();
    }

    Module testModule;
    TranslateToFuzzReader reader(testModule, std::move(bytes));
    reader.build();

    if (verbose) {
      std::cout << "Generated test module: \n";
      std::cout << testModule;
      std::cout << "\n";
    }

    // If a specific function and lattice element seed is specified, only run
    // that.
    if (latticeElementSeed && funcName) {
      runOnFunction(testModule.getFunction(*funcName), *latticeElementSeed);
      return;
    }

    ModuleUtils::iterDefinedFunctions(testModule, [&](Function* func) {
      uint64_t funcSeed = getRand();
      runOnFunction(func, funcSeed);
    });
  }